

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O2

Response execute_command(PingCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  json_value extraout_RDX;
  Response RVar1;
  string local_30;
  
  bin_str_to_hex(&local_30,(string *)((snap->db_name)._M_pathname._M_dataplus._M_p + 8));
  Response::ping((Response *)cmd,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  RVar1.content.m_value.object = extraout_RDX.object;
  RVar1.content._0_8_ = cmd;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command([[maybe_unused]] const PingCommand &cmd, Task *task,
                         [[maybe_unused]] const DatabaseSnapshot *snap) {
    return Response::ping(task->spec().hex_conn_id());
}